

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAdaptiveRhoInterval_Test::TestBody
          (OsqpTest_GetAdaptiveRhoInterval_Test *this)

{
  pointer *__ptr;
  anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertHelper local_1a8;
  AssertionResult gtest_ar__1;
  StatusOr<long_long> adaptive_rho_interval;
  OsqpSolver solver;
  AssertHelper local_178;
  AssertionResult gtest_ar;
  OsqpSettings settings;
  
  OsqpSettings::OsqpSettings(&settings);
  settings.adaptive_rho_interval = 0xc;
  solver.workspace_._M_t.
  super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
  super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>)
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)0x0;
  GetToyProblem();
  OsqpSolver::Init((OsqpSolver *)&gtest_ar__1,(OsqpInstance *)&solver,(OsqpSettings *)&gtest_ar);
  this_00 = &adaptive_rho_interval.super_StatusOrData<long_long>.field_1;
  adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.rep_._0_1_ =
       CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) == 1;
  adaptive_rho_interval.super_StatusOrData<long_long>.field_1.data_ = 0;
  absl::Status::~Status((Status *)&gtest_ar__1);
  OsqpInstance::~OsqpInstance((OsqpInstance *)&gtest_ar);
  if (adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.rep_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&adaptive_rho_interval,
               (AssertionResult *)"solver.Init(GetToyProblem(), settings).ok()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x253,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.rep_._0_4_ =
         OsqpSolver::Solve(&solver);
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_3_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)&gtest_ar,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&adaptive_rho_interval,(OsqpExitCode *)&gtest_ar__1);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      OsqpSolver::GetAdaptiveRhoInterval((OsqpSolver *)&adaptive_rho_interval);
      this_01 = &gtest_ar__1.message_;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bVar2 = CONCAT44(adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.rep_.
                       _4_4_,adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.
                             rep_._0_4_) == 1;
      gtest_ar__1.success_ = bVar2;
      if (bVar2) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_01);
        absl::internal_statusor::StatusOrData<long_long>::EnsureOk
                  (&adaptive_rho_interval.super_StatusOrData<long_long>);
        gtest_ar__1.success_ = true;
        gtest_ar__1._1_3_ = 0;
        testing::internal::CmpHelperEQ<long_long,int>
                  ((internal *)&gtest_ar,"*adaptive_rho_interval","12",
                   &adaptive_rho_interval.super_StatusOrData<long_long>.field_1.data_,
                   (int *)&gtest_ar__1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                     ,600,pcVar1);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
          }
        }
        this_01 = &gtest_ar.message_;
      }
      else {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                   (AssertionResult *)"adaptive_rho_interval.ok()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,599,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_1a8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_1a8.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_01);
      absl::Status::~Status((Status *)&adaptive_rho_interval);
      goto LAB_0011cfe2;
    }
    testing::Message::Message((Message *)&adaptive_rho_interval);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x254,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1,(Message *)&adaptive_rho_interval);
    this_00 = (anon_union_8_2_a3c22f61_for_StatusOrData<long_long>_3 *)&gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    if ((long *)CONCAT44(adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.rep_.
                         _4_4_,adaptive_rho_interval.super_StatusOrData<long_long>.field_0.status_.
                               rep_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(adaptive_rho_interval.super_StatusOrData<long_long>.field_0.
                                     status_.rep_._4_4_,
                                     adaptive_rho_interval.super_StatusOrData<long_long>.field_0.
                                     status_.rep_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
LAB_0011cfe2:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            (&solver.workspace_);
  return;
}

Assistant:

TEST(OsqpTest, GetAdaptiveRhoInterval) {
  OsqpSettings settings;
  settings.adaptive_rho_interval = 12;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  const auto adaptive_rho_interval = solver.GetAdaptiveRhoInterval();
  ASSERT_TRUE(adaptive_rho_interval.ok());
  EXPECT_EQ(*adaptive_rho_interval, 12);
}